

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O0

Pass * wasm::createGenerateDynCallsPass(void)

{
  GenerateDynCalls *this;
  
  this = (GenerateDynCalls *)operator_new(0x188);
  GenerateDynCalls::GenerateDynCalls(this,false);
  return (Pass *)this;
}

Assistant:

Pass* createGenerateDynCallsPass() { return new GenerateDynCalls(false); }